

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol
          (DescriptorPool *this,ConstStringParam symbol_name)

{
  Tables *pTVar1;
  pointer pcVar2;
  size_t sVar3;
  bool bVar4;
  char *str;
  char *pcVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  FileDescriptor *pFVar8;
  __hash_code _Var9;
  _Hash_node_base *p_Var10;
  char *pcVar11;
  StringPiece SVar12;
  Symbol result;
  MutexLockMaybe lock;
  key_type local_78;
  Symbol local_70;
  MutexLockMaybe local_68;
  Symbol local_60;
  SymbolBase local_58 [8];
  pointer local_50;
  size_t sStack_48;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_68,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
  }
  pTVar1 = (this->tables_)._M_t.
           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  pcVar2 = (symbol_name->_M_dataplus)._M_p;
  sVar3 = symbol_name->_M_string_length;
  if ((long)sVar3 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar3,"string length exceeds max size");
  }
  local_58[0].symbol_type_ = '\n';
  local_78.ptr_ = local_58;
  local_60.ptr_ = local_58;
  local_50 = pcVar2;
  sStack_48 = sVar3;
  SVar12 = Symbol::full_name(&local_60);
  pcVar5 = SVar12.ptr_;
  if ((long)SVar12.length_ < 1) {
    _Var9 = 0;
  }
  else {
    pcVar11 = pcVar5 + SVar12.length_;
    _Var9 = 0;
    do {
      _Var9 = (long)*pcVar5 + _Var9 * 5;
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 < pcVar11);
  }
  p_Var6 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(pTVar1->symbols_by_name_)._M_h,
                      _Var9 % *(size_type *)((long)&(pTVar1->symbols_by_name_)._M_h + 8),&local_78,
                      _Var9);
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var6->_M_nxt;
  }
  p_Var10 = p_Var7 + 1;
  if (p_Var7 == (_Hash_node_base *)0x0) {
    p_Var10 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
  }
  local_70.ptr_ = (SymbolBase *)p_Var10->_M_nxt;
  if (((_Hash_node_base *)local_70.ptr_ == (_Hash_node_base *)0x0) ||
     (*(char *)&((_Hash_node_base *)local_70.ptr_)->_M_nxt == '\0')) {
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar8 = FindFileContainingSymbol(this->underlay_,symbol_name),
       pFVar8 != (FileDescriptor *)0x0)) goto LAB_0034c9e2;
    SVar12.ptr_ = (symbol_name->_M_dataplus)._M_p;
    SVar12.length_ = symbol_name->_M_string_length;
    if ((long)symbol_name->_M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (symbol_name->_M_string_length,"string length exceeds max size");
    }
    bVar4 = TryFindSymbolInFallbackDatabase(this,SVar12);
    if (bVar4) {
      pTVar1 = (this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
               _M_head_impl;
      pcVar2 = (symbol_name->_M_dataplus)._M_p;
      sVar3 = symbol_name->_M_string_length;
      if ((long)sVar3 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (sVar3,"string length exceeds max size");
      }
      local_58[0].symbol_type_ = '\n';
      local_78.ptr_ = local_58;
      local_60.ptr_ = local_58;
      local_50 = pcVar2;
      sStack_48 = sVar3;
      SVar12 = Symbol::full_name(&local_60);
      pcVar5 = SVar12.ptr_;
      if ((long)SVar12.length_ < 1) {
        _Var9 = 0;
      }
      else {
        pcVar11 = pcVar5 + SVar12.length_;
        _Var9 = 0;
        do {
          _Var9 = (long)*pcVar5 + _Var9 * 5;
          pcVar5 = pcVar5 + 1;
        } while (pcVar5 < pcVar11);
      }
      p_Var6 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(pTVar1->symbols_by_name_)._M_h,
                          _Var9 % *(size_type *)((long)&(pTVar1->symbols_by_name_)._M_h + 8),
                          &local_78,_Var9);
      if (p_Var6 == (__node_base_ptr)0x0) {
        p_Var7 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var7 = p_Var6->_M_nxt;
      }
      p_Var10 = p_Var7 + 1;
      if (p_Var7 == (_Hash_node_base *)0x0) {
        p_Var10 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      }
      local_70.ptr_ = (SymbolBase *)p_Var10->_M_nxt;
      if (((_Hash_node_base *)local_70.ptr_ != (_Hash_node_base *)0x0) &&
         (*(char *)&((_Hash_node_base *)local_70.ptr_)->_M_nxt != '\0')) goto LAB_0034c8df;
    }
    pFVar8 = (FileDescriptor *)0x0;
  }
  else {
LAB_0034c8df:
    pFVar8 = Symbol::GetFile(&local_70);
  }
LAB_0034c9e2:
  if ((pthread_mutex_t *)local_68.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_68.mu_);
  }
  return pFVar8;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    ConstStringParam symbol_name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != nullptr) {
    const FileDescriptor* file_result =
        underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != nullptr) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return nullptr;
}